

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wang_index_impl.h
# Opt level: O2

double __thiscall
json::WangTreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>::jedi
          (WangTreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON> *this
          ,TreeIndexJSON *t1,TreeIndexJSON *t2)

{
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  vector<double,_std::allocator<double>_> *this_02;
  vector<double,_std::allocator<double>_> *this_03;
  size_type __n;
  Matrix<double> *this_04;
  Matrix<double> *this_05;
  Matrix<double> *this_06;
  Matrix<double> *this_07;
  Matrix<double> *this_08;
  Matrix<double> *this_09;
  uint uVar1;
  int iVar2;
  int iVar3;
  pointer pvVar4;
  int *piVar5;
  ulong col;
  reference pvVar6;
  double *pdVar7;
  pointer piVar8;
  long lVar9;
  double *pdVar10;
  pointer piVar11;
  uint uVar12;
  size_t sVar13;
  size_type __n_00;
  Matrix<double> *this_10;
  long lVar14;
  int i;
  size_type sVar15;
  size_t sVar16;
  size_t sVar17;
  ulong uVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar24;
  double local_188;
  double local_158;
  Matrix<double> local_a8;
  size_type local_80;
  WangTreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON> *local_78;
  size_type local_70;
  long local_68;
  Matrix<double> *local_60;
  double local_58;
  undefined8 uStack_50;
  size_t local_40;
  size_type local_38;
  
  (this->super_JEDIAlgorithm<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>).
  subproblem_counter_ = 0;
  uVar1 = (t1->super_Constants).tree_size_;
  uVar12 = (t2->super_Constants).tree_size_;
  col = (ulong)uVar12;
  if ((int)uVar1 < 1) {
    dVar21 = (double)(int)uVar12;
  }
  else if ((int)uVar12 < 1) {
    dVar21 = (double)(int)uVar1;
  }
  else {
    sVar16 = (size_t)(t1->super_PostLToHeight).postl_to_height_.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start[(ulong)uVar1 - 1];
    this_00 = &this->del_t1_subtree_;
    sVar15 = (ulong)uVar1 + 1;
    local_78 = this;
    std::vector<double,_std::allocator<double>_>::resize(this_00,sVar15);
    this_01 = &this->del_f1_subtree_;
    local_80 = sVar15;
    std::vector<double,_std::allocator<double>_>::resize(this_01,sVar15);
    this_02 = &this->ins_t2_subtree_;
    sVar15 = col + 1;
    std::vector<double,_std::allocator<double>_>::resize(this_02,sVar15);
    this_03 = &this->ins_f2_subtree_;
    std::vector<double,_std::allocator<double>_>::resize(this_03,sVar15);
    sVar17 = sVar16 + 1;
    local_40 = sVar16;
    data_structures::Matrix<double>::Matrix(&local_a8,sVar17,sVar15);
    this_04 = &this->dt_;
    data_structures::Matrix<double>::operator=(this_04,&local_a8);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&local_a8.data_.super__Vector_base<double,_std::allocator<double>_>);
    data_structures::Matrix<double>::Matrix(&local_a8,sVar17,sVar15);
    this_05 = &this->df_;
    data_structures::Matrix<double>::operator=(this_05,&local_a8);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&local_a8.data_.super__Vector_base<double,_std::allocator<double>_>);
    data_structures::Matrix<double>::Matrix(&local_a8,sVar17,sVar15);
    this_06 = &this->e0_;
    data_structures::Matrix<double>::operator=(this_06,&local_a8);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&local_a8.data_.super__Vector_base<double,_std::allocator<double>_>);
    data_structures::Matrix<double>::Matrix(&local_a8,sVar17,sVar15);
    this_07 = &this->e_;
    data_structures::Matrix<double>::operator=(this_07,&local_a8);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&local_a8.data_.super__Vector_base<double,_std::allocator<double>_>);
    data_structures::Matrix<double>::Matrix(&local_a8,sVar17,sVar15);
    this_08 = &this->del_forest_;
    data_structures::Matrix<double>::operator=(this_08,&local_a8);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&local_a8.data_.super__Vector_base<double,_std::allocator<double>_>);
    data_structures::Matrix<double>::Matrix(&local_a8,sVar17,sVar15);
    this_09 = &this->del_tree_;
    data_structures::Matrix<double>::operator=(this_09,&local_a8);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&local_a8.data_.super__Vector_base<double,_std::allocator<double>_>);
    local_70 = sVar15;
    data_structures::Matrix<double>::Matrix(&local_a8,sVar17,sVar15);
    this_10 = &this->fav_child_dt_;
    data_structures::Matrix<double>::operator=(this_10,&local_a8);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&local_a8.data_.super__Vector_base<double,_std::allocator<double>_>);
    data_structures::Matrix<double>::fill_with(this_04,INFINITY);
    data_structures::Matrix<double>::fill_with(this_05,INFINITY);
    data_structures::Matrix<double>::fill_with(this_06,0.0);
    data_structures::Matrix<double>::fill_with(this_07,0.0);
    data_structures::Matrix<double>::fill_with(this_08,INFINITY);
    data_structures::Matrix<double>::fill_with(this_09,INFINITY);
    local_60 = this_10;
    data_structures::Matrix<double>::fill_with(this_10,INFINITY);
    pvVar6 = std::vector<double,_std::allocator<double>_>::at(this_00,0);
    *pvVar6 = 0.0;
    pvVar6 = std::vector<double,_std::allocator<double>_>::at(this_01,0);
    *pvVar6 = 0.0;
    for (sVar15 = 1; sVar15 != local_80; sVar15 = sVar15 + 1) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::at(this_01,sVar15);
      *pvVar6 = 0.0;
      uVar12 = 0;
      while( true ) {
        pvVar4 = (t1->super_PostLToChildren).postl_to_children_.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar14 = *(long *)&pvVar4[sVar15 - 1].super__Vector_base<int,_std::allocator<int>_>._M_impl;
        if ((ulong)((long)*(pointer *)
                           ((long)&pvVar4[sVar15 - 1].super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl + 8) - lVar14 >> 2) < (ulong)(uVar12 + 1)) break;
        pvVar6 = std::vector<double,_std::allocator<double>_>::at
                           (this_00,(long)*(int *)(lVar14 + (ulong)uVar12 * 4) + 1);
        dVar21 = *pvVar6;
        pvVar6 = std::vector<double,_std::allocator<double>_>::at(this_01,sVar15);
        *pvVar6 = dVar21 + *pvVar6;
        uVar12 = uVar12 + 1;
      }
      pvVar6 = std::vector<double,_std::allocator<double>_>::at(this_01,sVar15);
      dVar21 = *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::at(this_00,sVar15);
      *pvVar6 = dVar21 + 1.0;
    }
    *(this_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
     _M_start = 0.0;
    *(this_03->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
     _M_start = 0.0;
    for (sVar15 = 1; sVar15 != local_70; sVar15 = sVar15 + 1) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::at(this_03,sVar15);
      *pvVar6 = 0.0;
      uVar12 = 0;
      while( true ) {
        pvVar4 = (t2->super_PostLToChildren).postl_to_children_.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar14 = *(long *)&pvVar4[sVar15 - 1].super__Vector_base<int,_std::allocator<int>_>._M_impl;
        if ((ulong)((long)*(pointer *)
                           ((long)&pvVar4[sVar15 - 1].super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl + 8) - lVar14 >> 2) < (ulong)(uVar12 + 1)) break;
        pvVar6 = std::vector<double,_std::allocator<double>_>::at
                           (this_02,(long)*(int *)(lVar14 + (ulong)uVar12 * 4) + 1);
        dVar21 = *pvVar6;
        pvVar6 = std::vector<double,_std::allocator<double>_>::at(this_03,sVar15);
        *pvVar6 = dVar21 + *pvVar6;
        uVar12 = uVar12 + 1;
      }
      pvVar6 = std::vector<double,_std::allocator<double>_>::at(this_03,sVar15);
      dVar21 = *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::at(this_02,sVar15);
      *pvVar6 = dVar21 + 1.0;
    }
    sVar15 = 1;
    while (sVar15 != local_80) {
      iVar2 = (t1->super_PostLToFavorableChildOrder).postl_to_favorder_.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [sVar15 - 1];
      lVar14 = (long)iVar2;
      __n = lVar14 + 1;
      local_68 = lVar14 * 0x18;
      local_38 = sVar15;
      for (__n_00 = 1; __n_00 != local_70; __n_00 = __n_00 + 1) {
        pvVar4 = (t1->super_PostLToChildren).postl_to_children_.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (*(long *)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl +
                     local_68 + 8) ==
            *(long *)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl +
                     local_68)) {
          dVar21 = INFINITY;
          local_58 = INFINITY;
          uStack_50 = 0;
        }
        else {
          pdVar7 = data_structures::Matrix<double>::at
                             (this_08,(long)(t1->super_PostLToHeight).postl_to_height_.
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start[lVar14],__n_00 - 1);
          local_58 = *pdVar7;
          uStack_50 = 0;
          pdVar7 = data_structures::Matrix<double>::at
                             (this_09,(long)(t1->super_PostLToHeight).postl_to_height_.
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start[lVar14],__n_00 - 1);
          dVar21 = *pdVar7;
        }
        sVar17 = __n_00 - 1;
        pvVar4 = (t2->super_PostLToChildren).postl_to_children_.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        piVar8 = *(pointer *)&pvVar4[sVar17].super__Vector_base<int,_std::allocator<int>_>._M_impl;
        piVar11 = *(pointer *)
                   ((long)&pvVar4[sVar17].super__Vector_base<int,_std::allocator<int>_>._M_impl + 8)
        ;
        local_158 = INFINITY;
        dVar24 = INFINITY;
        if (piVar11 != piVar8) {
          uVar12 = 0;
          auVar23 = _DAT_0010a030;
          while( true ) {
            uVar18 = (ulong)uVar12;
            if ((ulong)((long)piVar11 - (long)piVar8 >> 2) <= uVar18) break;
            pdVar7 = data_structures::Matrix<double>::at
                               (this_05,(long)(t1->super_PostLToHeight).postl_to_height_.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start[lVar14],
                                (long)piVar8[uVar18] + 1);
            dVar24 = *pdVar7;
            pvVar6 = std::vector<double,_std::allocator<double>_>::at
                               (this_03,(long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                                 postl_to_children_.
                                                                                                                                  
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar17].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + uVar18 * 4) + 1);
            dVar19 = *pvVar6;
            pdVar7 = data_structures::Matrix<double>::at
                               (this_04,(long)(t1->super_PostLToHeight).postl_to_height_.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start[lVar14],
                                (long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                         postl_to_children_.
                                                                                                                  
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar17].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + uVar18 * 4) + 1);
            dVar20 = *pdVar7;
            pvVar6 = std::vector<double,_std::allocator<double>_>::at
                               (this_02,(long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                                 postl_to_children_.
                                                                                                                                  
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar17].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + uVar18 * 4) + 1);
            auVar22._0_8_ = dVar24 - dVar19;
            auVar22._8_8_ = dVar20 - *pvVar6;
            auVar23 = minpd(auVar22,auVar23);
            uVar12 = uVar12 + 1;
            pvVar4 = (t2->super_PostLToChildren).postl_to_children_.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            piVar8 = *(pointer *)
                      &pvVar4[sVar17].super__Vector_base<int,_std::allocator<int>_>._M_impl;
            piVar11 = *(pointer *)
                       ((long)&pvVar4[sVar17].super__Vector_base<int,_std::allocator<int>_>._M_impl
                       + 8);
          }
          pvVar6 = std::vector<double,_std::allocator<double>_>::at(this_03,__n_00);
          dVar24 = *pvVar6;
          pvVar6 = std::vector<double,_std::allocator<double>_>::at(this_02,__n_00);
          local_158 = auVar23._0_8_;
          local_158 = local_158 + dVar24;
          dVar24 = auVar23._8_8_ + *pvVar6;
        }
        pvVar4 = (t1->super_PostLToChildren).postl_to_children_.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (*(long *)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl +
                     local_68 + 8) ==
            *(long *)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl +
                     local_68)) {
          pvVar6 = std::vector<double,_std::allocator<double>_>::at(this_03,__n_00);
          dVar19 = *pvVar6 + 0.0;
        }
        else {
          pvVar4 = (t2->super_PostLToChildren).postl_to_children_.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          piVar8 = *(pointer *)
                    ((long)&pvVar4[sVar17].super__Vector_base<int,_std::allocator<int>_>._M_impl + 8
                    );
          if (piVar8 == *(pointer *)
                         &pvVar4[sVar17].super__Vector_base<int,_std::allocator<int>_>._M_impl) {
            pvVar6 = std::vector<double,_std::allocator<double>_>::at(this_01,__n);
            dVar19 = *pvVar6 + 0.0;
          }
          else {
            pdVar7 = data_structures::Matrix<double>::at
                               (this_07,(long)(t1->super_PostLToHeight).postl_to_height_.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start[lVar14],
                                (long)piVar8[-1] + 1);
            dVar19 = *pdVar7;
          }
        }
        dVar20 = (double)(~-(ulong)(local_158 <= local_58) & (ulong)local_58 |
                         -(ulong)(local_158 <= local_58) & (ulong)local_158);
        uVar18 = -(ulong)(dVar19 <= dVar20);
        pdVar7 = data_structures::Matrix<double>::at
                           (this_05,(long)(t1->super_PostLToHeight).postl_to_height_.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start[lVar14],__n_00);
        *pdVar7 = (double)(uVar18 & (ulong)dVar19 | ~uVar18 & (ulong)dVar20);
        pdVar7 = data_structures::Matrix<double>::at
                           (this_05,(long)(t1->super_PostLToHeight).postl_to_height_.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start[lVar14],__n_00);
        dVar19 = *pdVar7;
        dVar20 = cost_model::UnitCostModelJSON<label::JSONLabel>::ren
                           ((local_78->
                            super_JEDIAlgorithm<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>
                            ).c_,(t1->super_PostLToLabelId).postl_to_label_id_.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[lVar14],
                            (t2->super_PostLToLabelId).postl_to_label_id_.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[sVar17]);
        pdVar7 = data_structures::Matrix<double>::at
                           (this_04,(long)(t1->super_PostLToHeight).postl_to_height_.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start[lVar14],__n_00);
        dVar21 = (double)(~-(ulong)(dVar24 <= dVar21) & (ulong)dVar21 |
                         (ulong)dVar24 & -(ulong)(dVar24 <= dVar21));
        uVar18 = -(ulong)(dVar20 + dVar19 <= dVar21);
        *pdVar7 = (double)(~uVar18 & (ulong)dVar21 | (ulong)(dVar20 + dVar19) & uVar18);
        if ((uint)__n != uVar1) {
          lVar9 = (long)(t1->super_PostLToParent).postl_to_parent_.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar14];
          piVar8 = (t1->super_PostLToHeight).postl_to_height_.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          sVar16 = (size_t)piVar8[lVar9];
          if ((t1->super_PostLToFavChild).postl_to_fav_child_.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [lVar9] == iVar2) {
            pdVar7 = data_structures::Matrix<double>::at(this_04,(long)piVar8[lVar14],__n_00);
            dVar21 = *pdVar7;
            pdVar7 = data_structures::Matrix<double>::at(local_60,sVar16,__n_00);
            *pdVar7 = dVar21;
            pvVar6 = std::vector<double,_std::allocator<double>_>::at
                               (this_01,(long)(t1->super_PostLToParent).postl_to_parent_.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start[lVar14] + 1);
            dVar21 = *pvVar6;
            pdVar7 = data_structures::Matrix<double>::at
                               (this_05,(long)(t1->super_PostLToHeight).postl_to_height_.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start[lVar14],__n_00);
            dVar24 = *pdVar7;
            pvVar6 = std::vector<double,_std::allocator<double>_>::at(this_01,__n);
            dVar19 = *pvVar6;
            pdVar7 = data_structures::Matrix<double>::at(this_08,sVar16,sVar17);
            *pdVar7 = (dVar21 + dVar24) - dVar19;
            pvVar6 = std::vector<double,_std::allocator<double>_>::at
                               (this_00,(long)(t1->super_PostLToParent).postl_to_parent_.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start[lVar14] + 1);
            dVar21 = *pvVar6;
            pdVar7 = data_structures::Matrix<double>::at
                               (this_04,(long)(t1->super_PostLToHeight).postl_to_height_.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start[lVar14],__n_00);
            dVar24 = *pdVar7;
            pvVar6 = std::vector<double,_std::allocator<double>_>::at(this_00,__n);
            dVar19 = *pvVar6;
            pdVar7 = data_structures::Matrix<double>::at(this_09,sVar16,sVar17);
            *pdVar7 = (dVar21 + dVar24) - dVar19;
            uVar12 = 0;
            pdVar7 = data_structures::Matrix<double>::at(this_07,sVar16,0);
            *pdVar7 = 0.0;
            while( true ) {
              uVar18 = (ulong)uVar12;
              pvVar4 = (t2->super_PostLToChildren).postl_to_children_.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              lVar9 = *(long *)&pvVar4[sVar17].super__Vector_base<int,_std::allocator<int>_>._M_impl
              ;
              if ((ulong)((long)*(pointer *)
                                 ((long)&pvVar4[sVar17].
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl + 8)
                          - lVar9 >> 2) <= uVar18) break;
              if (uVar18 == 0) {
                sVar13 = 0;
              }
              else {
                sVar13 = (long)*(int *)(lVar9 + (ulong)(uVar12 - 1) * 4) + 1;
              }
              pdVar7 = data_structures::Matrix<double>::at(this_07,sVar16,sVar13);
              dVar21 = *pdVar7;
              pvVar6 = std::vector<double,_std::allocator<double>_>::at
                                 (this_02,(long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                                   postl_to_children_.
                                                                                                                                      
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar17].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + uVar18 * 4) + 1);
              dVar24 = *pvVar6;
              pdVar7 = data_structures::Matrix<double>::at
                                 (this_07,sVar16,
                                  (long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                           postl_to_children_.
                                                                                                                      
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar17].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + uVar18 * 4) + 1);
              *pdVar7 = dVar21 + dVar24;
              uVar12 = uVar12 + 1;
            }
            lVar9 = (long)(t1->super_PostLToParent).postl_to_parent_.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar14];
          }
          pvVar4 = (t1->super_PostLToChildren).postl_to_children_.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          piVar5 = *(int **)&pvVar4[lVar9].super__Vector_base<int,_std::allocator<int>_>._M_impl;
          if (((*(pointer *)
                 ((long)&pvVar4[lVar9].super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) !=
                piVar5) && (*piVar5 == iVar2)) ||
             ((t1->super_PostLToFavChild).postl_to_fav_child_.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [lVar9] != iVar2)) {
            pdVar7 = data_structures::Matrix<double>::at(this_08,sVar16,sVar17);
            pvVar6 = std::vector<double,_std::allocator<double>_>::at
                               (this_01,(long)(t1->super_PostLToParent).postl_to_parent_.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start[lVar14] + 1);
            dVar21 = *pvVar6;
            pdVar10 = data_structures::Matrix<double>::at
                                (this_05,(long)(t1->super_PostLToHeight).postl_to_height_.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start[lVar14],__n_00);
            dVar24 = *pdVar10;
            pvVar6 = std::vector<double,_std::allocator<double>_>::at(this_01,__n);
            dVar21 = (dVar21 + dVar24) - *pvVar6;
            if (*pdVar7 <= dVar21) {
              dVar21 = *pdVar7;
            }
            pdVar7 = data_structures::Matrix<double>::at(this_08,sVar16,sVar17);
            *pdVar7 = dVar21;
            pdVar7 = data_structures::Matrix<double>::at(this_09,sVar16,sVar17);
            pvVar6 = std::vector<double,_std::allocator<double>_>::at
                               (this_00,(long)(t1->super_PostLToParent).postl_to_parent_.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start[lVar14] + 1);
            dVar21 = *pvVar6;
            pdVar10 = data_structures::Matrix<double>::at
                                (this_04,(long)(t1->super_PostLToHeight).postl_to_height_.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start[lVar14],__n_00);
            dVar24 = *pdVar10;
            pvVar6 = std::vector<double,_std::allocator<double>_>::at(this_00,__n);
            dVar21 = (dVar21 + dVar24) - *pvVar6;
            if (*pdVar7 <= dVar21) {
              dVar21 = *pdVar7;
            }
            pdVar7 = data_structures::Matrix<double>::at(this_09,sVar16,sVar17);
            *pdVar7 = dVar21;
            uVar12 = 0;
            pdVar7 = data_structures::Matrix<double>::at(this_07,sVar16,0);
            dVar21 = *pdVar7;
            pdVar7 = data_structures::Matrix<double>::at(this_06,sVar16,0);
            *pdVar7 = dVar21;
            while( true ) {
              uVar18 = (ulong)uVar12;
              pvVar4 = (t2->super_PostLToChildren).postl_to_children_.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              lVar9 = *(long *)&pvVar4[sVar17].super__Vector_base<int,_std::allocator<int>_>._M_impl
              ;
              if ((ulong)((long)*(pointer *)
                                 ((long)&pvVar4[sVar17].
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl + 8)
                          - lVar9 >> 2) <= uVar18) break;
              pdVar7 = data_structures::Matrix<double>::at
                                 (this_07,sVar16,(long)*(int *)(lVar9 + uVar18 * 4) + 1);
              dVar21 = *pdVar7;
              pdVar7 = data_structures::Matrix<double>::at
                                 (this_06,sVar16,
                                  (long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                           postl_to_children_.
                                                                                                                      
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar17].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + uVar18 * 4) + 1);
              *pdVar7 = dVar21;
              uVar12 = uVar12 + 1;
            }
            uVar12 = 0;
            pdVar7 = data_structures::Matrix<double>::at(this_06,sVar16,0);
            dVar21 = *pdVar7;
            pvVar6 = std::vector<double,_std::allocator<double>_>::at(this_00,__n);
            dVar24 = *pvVar6;
            pdVar7 = data_structures::Matrix<double>::at(this_07,sVar16,0);
            *pdVar7 = dVar21 + dVar24;
            while( true ) {
              uVar18 = (ulong)uVar12;
              pvVar4 = (t2->super_PostLToChildren).postl_to_children_.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              lVar9 = *(long *)&pvVar4[sVar17].super__Vector_base<int,_std::allocator<int>_>._M_impl
              ;
              if ((ulong)((long)*(pointer *)
                                 ((long)&pvVar4[sVar17].
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl + 8)
                          - lVar9 >> 2) <= uVar18) break;
              if (uVar18 == 0) {
                pdVar7 = data_structures::Matrix<double>::at(this_07,sVar16,0);
                local_188 = *pdVar7;
                pvVar6 = std::vector<double,_std::allocator<double>_>::at
                                   (this_02,(long)**(int **)&(t2->super_PostLToChildren).
                                                             postl_to_children_.
                                                                                                                          
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar17].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + 1);
                local_188 = local_188 + *pvVar6;
                pdVar7 = data_structures::Matrix<double>::at
                                   (this_06,sVar16,
                                    (long)**(int **)&(t2->super_PostLToChildren).postl_to_children_.
                                                                                                          
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar17].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + 1);
                dVar21 = *pdVar7;
                pvVar6 = std::vector<double,_std::allocator<double>_>::at(this_00,__n);
                dVar21 = dVar21 + *pvVar6;
                sVar13 = 0;
              }
              else {
                pdVar7 = data_structures::Matrix<double>::at
                                   (this_07,sVar16,
                                    (long)*(int *)(lVar9 + (ulong)(uVar12 - 1) * 4) + 1);
                local_188 = *pdVar7;
                pvVar6 = std::vector<double,_std::allocator<double>_>::at
                                   (this_02,(long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                                     postl_to_children_.
                                                                                                                                          
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar17].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + uVar18 * 4) + 1);
                local_188 = local_188 + *pvVar6;
                pdVar7 = data_structures::Matrix<double>::at
                                   (this_06,sVar16,
                                    (long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                             postl_to_children_.
                                                                                                                          
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar17].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + uVar18 * 4) + 1);
                dVar21 = *pdVar7;
                pvVar6 = std::vector<double,_std::allocator<double>_>::at(this_00,__n);
                dVar21 = dVar21 + *pvVar6;
                sVar13 = (long)*(int *)(*(long *)&(t2->super_PostLToChildren).postl_to_children_.
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar17].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + (ulong)(uVar12 - 1) * 4) + 1;
              }
              pdVar7 = data_structures::Matrix<double>::at(this_06,sVar16,sVar13);
              dVar24 = *pdVar7;
              pdVar7 = data_structures::Matrix<double>::at
                                 (this_04,(long)(t1->super_PostLToHeight).postl_to_height_.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start[lVar14],
                                  (long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                           postl_to_children_.
                                                                                                                      
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar17].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + uVar18 * 4) + 1);
              dVar19 = dVar24 + *pdVar7;
              if (dVar21 <= dVar24 + *pdVar7) {
                dVar19 = dVar21;
              }
              if (local_188 <= dVar19) {
                dVar19 = local_188;
              }
              pdVar7 = data_structures::Matrix<double>::at
                                 (this_07,sVar16,
                                  (long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                           postl_to_children_.
                                                                                                                      
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar17].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + uVar18 * 4) + 1);
              *pdVar7 = dVar19;
              uVar12 = uVar12 + 1;
            }
            if (__n_00 != col) {
              pdVar7 = data_structures::Matrix<double>::at(this_06,sVar16,0);
              dVar21 = *pdVar7;
              pdVar7 = data_structures::Matrix<double>::at(this_07,sVar16,0);
              *pdVar7 = dVar21;
            }
          }
          iVar3 = (t1->super_PostLToParent).postl_to_parent_.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[lVar14];
          if ((t1->super_PostLToFavChild).postl_to_left_fav_child_.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [iVar3] == iVar2) {
            iVar3 = (t1->super_PostLToFavChild).postl_to_fav_child_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start[iVar3];
            pdVar7 = data_structures::Matrix<double>::at(this_07,sVar16,0);
            local_58 = (double)CONCAT44(local_58._4_4_,(int)*pdVar7);
            pdVar7 = data_structures::Matrix<double>::at(this_07,sVar16,0);
            dVar21 = *pdVar7;
            pdVar7 = data_structures::Matrix<double>::at(this_06,sVar16,0);
            *pdVar7 = dVar21;
            if (__n_00 != col) {
              pvVar6 = std::vector<double,_std::allocator<double>_>::at(this_00,__n);
              dVar21 = *pvVar6;
              pdVar7 = data_structures::Matrix<double>::at(this_06,sVar16,0);
              *pdVar7 = dVar21 + *pdVar7;
            }
            sVar15 = (long)iVar3 + 1;
            uVar12 = 0;
            while( true ) {
              uVar18 = (ulong)uVar12;
              pvVar4 = (t2->super_PostLToChildren).postl_to_children_.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              lVar9 = *(long *)&pvVar4[sVar17].super__Vector_base<int,_std::allocator<int>_>._M_impl
              ;
              if ((ulong)((long)*(pointer *)
                                 ((long)&pvVar4[sVar17].
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl + 8)
                          - lVar9 >> 2) <= uVar18) break;
              pdVar7 = data_structures::Matrix<double>::at
                                 (this_07,sVar16,(long)*(int *)(lVar9 + uVar18 * 4) + 1);
              dVar21 = *pdVar7;
              pdVar7 = data_structures::Matrix<double>::at
                                 (this_06,sVar16,
                                  (long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                           postl_to_children_.
                                                                                                                      
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar17].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + uVar18 * 4) + 1);
              *pdVar7 = dVar21;
              uVar12 = uVar12 + 1;
            }
            uVar12 = 0;
            pdVar7 = data_structures::Matrix<double>::at(this_06,sVar16,0);
            dVar21 = *pdVar7;
            pvVar6 = std::vector<double,_std::allocator<double>_>::at(this_00,sVar15);
            dVar24 = *pvVar6;
            pdVar7 = data_structures::Matrix<double>::at(this_07,sVar16,0);
            *pdVar7 = dVar21 + dVar24;
            while( true ) {
              uVar18 = (ulong)uVar12;
              pvVar4 = (t2->super_PostLToChildren).postl_to_children_.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              lVar9 = *(long *)&pvVar4[sVar17].super__Vector_base<int,_std::allocator<int>_>._M_impl
              ;
              if ((ulong)((long)*(pointer *)
                                 ((long)&pvVar4[sVar17].
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl + 8)
                          - lVar9 >> 2) <= uVar18) break;
              if (uVar18 == 0) {
                pdVar7 = data_structures::Matrix<double>::at(this_07,sVar16,0);
                local_188 = *pdVar7;
                pvVar6 = std::vector<double,_std::allocator<double>_>::at
                                   (this_02,(long)**(int **)&(t2->super_PostLToChildren).
                                                             postl_to_children_.
                                                                                                                          
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar17].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + 1);
                local_188 = local_188 + *pvVar6;
                pdVar7 = data_structures::Matrix<double>::at
                                   (this_06,sVar16,
                                    (long)**(int **)&(t2->super_PostLToChildren).postl_to_children_.
                                                                                                          
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar17].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + 1);
                dVar21 = *pdVar7;
                pvVar6 = std::vector<double,_std::allocator<double>_>::at(this_00,sVar15);
                dVar21 = dVar21 + *pvVar6;
                sVar13 = 0;
              }
              else {
                pdVar7 = data_structures::Matrix<double>::at
                                   (this_07,sVar16,
                                    (long)*(int *)(lVar9 + (ulong)(uVar12 - 1) * 4) + 1);
                local_188 = *pdVar7;
                pvVar6 = std::vector<double,_std::allocator<double>_>::at
                                   (this_02,(long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                                     postl_to_children_.
                                                                                                                                          
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar17].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + uVar18 * 4) + 1);
                local_188 = local_188 + *pvVar6;
                pdVar7 = data_structures::Matrix<double>::at
                                   (this_06,sVar16,
                                    (long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                             postl_to_children_.
                                                                                                                          
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar17].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + uVar18 * 4) + 1);
                dVar21 = *pdVar7;
                pvVar6 = std::vector<double,_std::allocator<double>_>::at(this_00,sVar15);
                dVar21 = dVar21 + *pvVar6;
                sVar13 = (long)*(int *)(*(long *)&(t2->super_PostLToChildren).postl_to_children_.
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar17].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + (ulong)(uVar12 - 1) * 4) + 1;
              }
              pdVar7 = data_structures::Matrix<double>::at(this_06,sVar16,sVar13);
              dVar24 = *pdVar7;
              pdVar7 = data_structures::Matrix<double>::at
                                 (local_60,sVar16,
                                  (long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                           postl_to_children_.
                                                                                                                      
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar17].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + uVar18 * 4) + 1);
              dVar19 = dVar24 + *pdVar7;
              if (dVar21 <= dVar24 + *pdVar7) {
                dVar19 = dVar21;
              }
              if (local_188 <= dVar19) {
                dVar19 = local_188;
              }
              pdVar7 = data_structures::Matrix<double>::at
                                 (this_07,sVar16,
                                  (long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                           postl_to_children_.
                                                                                                                      
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar17].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + uVar18 * 4) + 1);
              *pdVar7 = dVar19;
              uVar12 = uVar12 + 1;
            }
            if (__n_00 != col) {
              dVar21 = (double)local_58._0_4_;
              pdVar7 = data_structures::Matrix<double>::at(this_07,sVar16,0);
              *pdVar7 = dVar21;
            }
          }
        }
      }
      sVar15 = local_38 + 1;
    }
    pdVar7 = data_structures::Matrix<double>::at(this_04,local_40,col);
    dVar21 = *pdVar7;
  }
  return dVar21;
}

Assistant:

double WangTreeIndex<CostModel, TreeIndex>::jedi(const TreeIndex& t1, 
    const TreeIndex& t2) {

  // Reset subproblem counter.
  subproblem_counter_ = 0;
  
  int t1_input_size = t1.tree_size_;
  int t2_input_size = t2.tree_size_;
  // Stop if one of the trees is empty.
  if (t1_input_size < 1) {
    return t2_input_size;
  } else if (t2_input_size < 1) {
    return t1_input_size;
  }
  int t1_height = t1.postl_to_height_[t1_input_size-1];

  // Create cost matrices.
  del_t1_subtree_.resize(t1_input_size+1);
  del_f1_subtree_.resize(t1_input_size+1);
  ins_t2_subtree_.resize(t2_input_size+1);
  ins_f2_subtree_.resize(t2_input_size+1);
  dt_ = data_structures::Matrix<double>(t1_height+1, t2_input_size+1);
  df_ = data_structures::Matrix<double>(t1_height+1, t2_input_size+1);
  e0_ = data_structures::Matrix<double>(t1_height+1, t2_input_size+1);
  e_ = data_structures::Matrix<double>(t1_height+1, t2_input_size+1);
  del_forest_ = data_structures::Matrix<double>(t1_height+1, t2_input_size+1);
  del_tree_ = data_structures::Matrix<double>(t1_height+1, t2_input_size+1);
  fav_child_dt_ = data_structures::Matrix<double>(t1_height+1, t2_input_size+1);
  
  // Fill the matrices with inf.
  dt_.fill_with(std::numeric_limits<double>::infinity());
  df_.fill_with(std::numeric_limits<double>::infinity());
  e0_.fill_with(0);
  e_.fill_with(0);
  del_forest_.fill_with(std::numeric_limits<double>::infinity());
  del_tree_.fill_with(std::numeric_limits<double>::infinity());
  fav_child_dt_.fill_with(std::numeric_limits<double>::infinity());

  // Initialize cost matrices.
  del_t1_subtree_.at(0) = 0;
  del_f1_subtree_.at(0) = 0;
  for (int i = 1; i <= t1_input_size; ++i) {
    del_f1_subtree_.at(i) = 0;
    for (unsigned int k = 1; k <= t1.postl_to_children_[i-1].size(); ++k) {
      del_f1_subtree_.at(i) += del_t1_subtree_.at(t1.postl_to_children_[i-1][k-1] + 1);
    }
    del_t1_subtree_.at(i) = del_f1_subtree_.at(i) + c_.del(t1.postl_to_label_id_[i - 1]);
  }

  ins_t2_subtree_[0] = 0;
  ins_f2_subtree_[0] = 0;
  for (int j = 1; j <= t2_input_size; ++j) {
    ins_f2_subtree_.at(j) = 0;
    for (unsigned int k = 1; k <= t2.postl_to_children_[j-1].size(); ++k) {
      ins_f2_subtree_.at(j) += ins_t2_subtree_.at(t2.postl_to_children_[j-1][k-1] + 1);
    }
    ins_t2_subtree_.at(j) = ins_f2_subtree_.at(j) + c_.ins(t2.postl_to_label_id_[j - 1]);
  }
  
  double min_for_ins = std::numeric_limits<double>::infinity();
  double min_tree_ins = std::numeric_limits<double>::infinity();
  double min_for_del = std::numeric_limits<double>::infinity();
  double min_tree_del = std::numeric_limits<double>::infinity();
  double min_for_ren = std::numeric_limits<double>::infinity();
  double min_tree_ren = std::numeric_limits<double>::infinity();
  int i = 0;
  
  for (int x = 1; x <= t1_input_size; ++x) {
    // Get postorder number from favorable child order number.
    i = t1.postl_to_favorder_[x-1] + 1;
    // std::cout << "i: " << i << "\t";
    for (int j = 1; j <= t2_input_size; ++j) {
      // std::cout << "i: " << i << ", j: " << j << std::endl;
      // Cost for deletion.
      if (t1.postl_to_children_[i-1].size() == 0) {
        // t1[i] is a leaf node. Therefore, all nodes of F2 have to be inserted.
        // Must be set to infinity, since we allow infinity costs for different node types.
        min_for_del = std::numeric_limits<double>::infinity(); //ins_f2_subtree_.at(j);
        min_tree_del = std::numeric_limits<double>::infinity(); //ins_t2_subtree_.at(j);
      } else {
        // t1[i] is no leaf node. Therefore, read the previously computed value.
        min_for_del = del_forest_.at(t1.postl_to_height_[i-1], j-1);
        min_tree_del = del_tree_.at(t1.postl_to_height_[i-1], j-1);
      }

      // Cost for insertion.
      if (t2.postl_to_children_[j-1].size() == 0) {
        // t2[j] is a leaf node. Therefore, all nodes of F1 have to be inserted.
        // Must be set to infinity, since we allow infinity costs for different node types.
        min_for_ins = std::numeric_limits<double>::infinity(); //del_f1_subtree_.at(i);
        min_tree_ins = std::numeric_limits<double>::infinity(); //del_t1_subtree_.at(i);
      } else {
        // t2[j] is no leaf node. Therefore, computed the value.
        min_for_ins = std::numeric_limits<double>::infinity();
        min_tree_ins = std::numeric_limits<double>::infinity();
        for (unsigned int t = 0; t < t2.postl_to_children_[j-1].size(); ++t) {
          min_for_ins = std::min(min_for_ins,
              (df_.at(t1.postl_to_height_[i-1], t2.postl_to_children_[j-1][t] + 1) - 
               ins_f2_subtree_.at(t2.postl_to_children_[j-1][t] + 1)));
          min_tree_ins = std::min(min_tree_ins,
              (dt_.at(t1.postl_to_height_[i-1], t2.postl_to_children_[j-1][t] + 1) - 
               ins_t2_subtree_.at(t2.postl_to_children_[j-1][t] + 1)));
        }
        min_for_ins += ins_f2_subtree_.at(j);
        min_tree_ins += ins_t2_subtree_.at(j);
      }

      // Cost for rename.
      min_for_ren = 0;
      if (t1.postl_to_children_[i-1].size() == 0) {
        // t1[i] is a leaf node. Therefore, all nodes of F2 have to be inserted.
        min_for_ren += ins_f2_subtree_.at(j);
      } else if (t2.postl_to_children_[j-1].size() == 0) {
        // t2[j] is a leaf node. Therefore, all nodes of F1 have to be deleted.
        min_for_ren += del_f1_subtree_.at(i);
      } else {
        min_for_ren = e_.at(t1.postl_to_height_[i-1], t2.postl_to_children_[j-1][t2.postl_to_children_[j-1].size()-1]+1);
      }
      // Fill forest distance matrix.
      df_.at(t1.postl_to_height_[i-1], j) = min_for_del >= min_for_ins ? min_for_ins >= min_for_ren ? min_for_ren : min_for_ins : min_for_del >= min_for_ren ? min_for_ren : min_for_del;
      // Compute tree rename based on forest cost matrix.
      min_tree_ren = df_.at(t1.postl_to_height_[i-1], j) + c_.ren(t1.postl_to_label_id_[i-1], t2.postl_to_label_id_[j-1]);

      // Fill tree distance matrix.
      dt_.at(t1.postl_to_height_[i-1], j) = min_tree_del >= min_tree_ins ? min_tree_ins >= min_tree_ren ? min_tree_ren : min_tree_ins : min_tree_del >= min_tree_ren ? min_tree_ren : min_tree_del;

      // Do not compute for the parent of the root node in T1.
      if (i != t1_input_size)
      {
        int p_i = t1.postl_to_height_[t1.postl_to_parent_[i-1]];
        // Case 1: i is favorable child of parent.
        if (t1.postl_to_fav_child_[t1.postl_to_parent_[i-1]] == i-1) {
          fav_child_dt_.at(p_i, j) = dt_.at(t1.postl_to_height_[i-1], j);
          del_forest_.at(p_i, j-1) = del_f1_subtree_.at(t1.postl_to_parent_[i-1]+1) + df_.at(t1.postl_to_height_[i-1], j) - del_f1_subtree_.at(i);
          del_tree_.at  (p_i, j-1) = del_t1_subtree_.at(t1.postl_to_parent_[i-1]+1) + dt_.at(t1.postl_to_height_[i-1], j) - del_t1_subtree_.at(i);
          e_.at(p_i, 0) = 0;
          for (unsigned int t = 0; t < t2.postl_to_children_[j-1].size(); ++t) {
            if (t == 0) {
              e_.at(p_i, t2.postl_to_children_[j-1][t]+1) = e_.at(p_i, 0) + ins_t2_subtree_.at(t2.postl_to_children_[j-1][t]+1);
            } else {
              e_.at(p_i, t2.postl_to_children_[j-1][t]+1) = e_.at(p_i, t2.postl_to_children_[j-1][t-1]+1) + ins_t2_subtree_.at(t2.postl_to_children_[j-1][t]+1);
            }
          }
        }
        // Case 2: i is either leftmost child (and favorable) OR not favorable child.
        if ((t1.postl_to_children_[t1.postl_to_parent_[i-1]].size() > 0 && 
            t1.postl_to_children_[t1.postl_to_parent_[i-1]][0] == i-1) ||
            t1.postl_to_fav_child_[t1.postl_to_parent_[i-1]] != i-1) {
          del_forest_.at(p_i, j-1) = std::min(del_forest_.at(p_i, j-1), del_f1_subtree_.at(t1.postl_to_parent_[i-1]+1) + df_.at(t1.postl_to_height_[i-1], j) - del_f1_subtree_.at(i));
          del_tree_.at(p_i, j-1) = std::min(del_tree_.at(p_i, j-1), del_t1_subtree_.at(t1.postl_to_parent_[i-1]+1) + dt_.at(t1.postl_to_height_[i-1], j) - del_t1_subtree_.at(i));
          // Copy e into e0.
          e0_.at(p_i, 0) = e_.at(p_i, 0);
          for (unsigned int t = 0; t < t2.postl_to_children_[j-1].size(); ++t) {
            e0_.at(p_i, t2.postl_to_children_[j-1][t] + 1) = e_.at(p_i, t2.postl_to_children_[j-1][t] + 1);
          }
          // Fill next line.
          e_.at(p_i, 0) = e0_.at(p_i, 0) + del_t1_subtree_.at(i);
          for (unsigned int t = 0; t < t2.postl_to_children_[j-1].size(); ++t) {
            if (t == 0) {
              e_.at(p_i, t2.postl_to_children_[j-1][t]+1) = std::min(
                 e_.at(p_i, 0)                                 + ins_t2_subtree_.at(t2.postl_to_children_[j-1][t]+1), std::min(
                e0_.at(p_i, t2.postl_to_children_[j-1][t]  +1) + del_t1_subtree_.at(i),
                e0_.at(p_i, 0)                                 + dt_.at(t1.postl_to_height_[i-1], t2.postl_to_children_[j-1][t]+1))
              );
            } else {
              e_.at(p_i, t2.postl_to_children_[j-1][t]+1) = std::min(
                 e_.at(p_i, t2.postl_to_children_[j-1][t-1]+1) + ins_t2_subtree_.at(t2.postl_to_children_[j-1][t]+1), std::min(
                e0_.at(p_i, t2.postl_to_children_[j-1][t]  +1) + del_t1_subtree_.at(i),
                e0_.at(p_i, t2.postl_to_children_[j-1][t-1]+1) + dt_.at(t1.postl_to_height_[i-1], t2.postl_to_children_[j-1][t]+1))
              );
            }
          }
          if (j != t2_input_size) {
            e_.at(p_i, 0) = e0_.at(p_i, 0);
          }
        }
        // Case 3: t[i] is the left sibling of the favorable child.
        if (t1.postl_to_left_fav_child_[t1.postl_to_parent_[i-1]] == i-1) {
          int fav_child_postid = t1.postl_to_fav_child_[t1.postl_to_parent_[i-1]]+1;
          // Store initial value of first column in edit distance cost matrix.
          // It is needed for the next j. Therefore rewrite at the end.
          int old_val = e_.at(p_i, 0);
          // Copy e into e0.
          e0_.at(p_i, 0) = e_.at(p_i, 0);
          if (j != t2_input_size) {
            e0_.at(p_i, 0) += del_t1_subtree_.at(i);
          }
          for (unsigned int t = 0; t < t2.postl_to_children_[j-1].size(); ++t) {
            e0_.at(p_i, t2.postl_to_children_[j-1][t] + 1) = e_.at(p_i, t2.postl_to_children_[j-1][t] + 1);
          }
          // Fill next line.
          e_.at(p_i, 0) = e0_.at(p_i, 0) + del_t1_subtree_.at(fav_child_postid);
          for (unsigned int t = 0; t < t2.postl_to_children_[j-1].size(); ++t) {
            if (t == 0) {
              e_.at(p_i, t2.postl_to_children_[j-1][t]+1) = std::min(
                 e_.at(p_i, 0)                                 + ins_t2_subtree_.at(t2.postl_to_children_[j-1][t]+1), std::min(
                e0_.at(p_i, t2.postl_to_children_[j-1][t]  +1) + del_t1_subtree_.at(fav_child_postid),
                e0_.at(p_i, 0)                                 + fav_child_dt_.at(p_i, t2.postl_to_children_[j-1][t]+1))
              );
            } else {
              e_.at(p_i, t2.postl_to_children_[j-1][t]+1) = std::min(
                 e_.at(p_i, t2.postl_to_children_[j-1][t-1]+1) + ins_t2_subtree_.at(t2.postl_to_children_[j-1][t]+1), std::min(
                e0_.at(p_i, t2.postl_to_children_[j-1][t]  +1) + del_t1_subtree_.at(fav_child_postid),
                e0_.at(p_i, t2.postl_to_children_[j-1][t-1]+1) + fav_child_dt_.at(p_i, t2.postl_to_children_[j-1][t]+1))
              );
            }
          }
          if (j != t2_input_size) {
            e_.at(p_i, 0) = old_val;
          }
        }
      }
    }
  }

  return dt_.at(t1_height, t2_input_size);
}